

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O2

void __thiscall sznet::net::EventLoop::doPendingFunctors(EventLoop *this)

{
  MutexLock *pMVar1;
  Functor *functor;
  MutexLockGuard this_00;
  MutexLockGuard local_40;
  MutexLockGuard lock;
  vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> functors;
  
  lock.m_mutex = (MutexLock *)0x0;
  this->m_callingPendingFunctors = true;
  local_40.m_mutex = &this->m_mutex;
  MutexLock::lock(local_40.m_mutex);
  lock.m_mutex = (MutexLock *)
                 (this->m_pendingFunctors).
                 super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  pMVar1 = (MutexLock *)
           (this->m_pendingFunctors).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (this->m_pendingFunctors).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_pendingFunctors).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_pendingFunctors).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  MutexLockGuard::~MutexLockGuard(&local_40);
  for (this_00.m_mutex = lock.m_mutex; this_00.m_mutex != pMVar1;
      this_00.m_mutex = (MutexLock *)&((this_00.m_mutex)->m_mutex).__data.__list.__next) {
    std::function<void_()>::operator()((function<void_()> *)this_00.m_mutex);
  }
  this->m_callingPendingFunctors = false;
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector
            ((vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)&lock);
  return;
}

Assistant:

void EventLoop::doPendingFunctors()
{
	std::vector<Functor> functors;
	m_callingPendingFunctors = true;

	{
		MutexLockGuard lock(m_mutex);
		// 不是简单地在临界区依次调用Functor，而是把回调列表swap()到局部变量functors中，
		// 这样做，一方面减小了临界区的长度(不会阻塞其他线程调用queueInLoop())，
		// 另一方面避免了死锁(因为Functor可能再调用queueInLoop())。
		functors.swap(m_pendingFunctors);
	}

	for (const Functor& functor : functors)
	{
		functor();
	}

	m_callingPendingFunctors = false;
}